

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O3

void __thiscall slang::ast::ScriptSession::ScriptSession(ScriptSession *this,Bag *options)

{
  size_t sVar1;
  size_t sVar2;
  value_type_pointer ppVar3;
  CompilationOptions *pCVar4;
  CompilationUnitSymbol *pCVar5;
  
  sVar1 = (options->items).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
          .arrays.groups_size_index;
  sVar2 = (options->items).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
          .arrays.groups_size_mask;
  ppVar3 = (options->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.elements_;
  (this->options).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_ =
       (options->items).table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
       .arrays.groups_;
  (this->options).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.elements_ = ppVar3;
  (this->options).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_size_index = sVar1;
  (this->options).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_size_mask = sVar2;
  sVar1 = (options->items).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
          .size_ctrl.size;
  (this->options).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .size_ctrl.ml =
       (options->items).table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
       .size_ctrl.ml;
  (this->options).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .size_ctrl.size = sVar1;
  (options->items).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_size_index = 0x3f;
  (options->items).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_size_mask = 1;
  (options->items).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (options->items).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (options->items).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .size_ctrl.ml = 0;
  (options->items).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .size_ctrl.size = 0;
  pCVar4 = Bag::insertOrGet<slang::ast::CompilationOptions>(&this->options);
  *(byte *)&(pCVar4->flags).m_bits = (byte)(pCVar4->flags).m_bits | 1;
  Compilation::Compilation(&this->compilation,&this->options,(SourceLibrary *)0x0);
  pCVar5 = Compilation::createScriptScope(&this->compilation);
  this->scope = pCVar5;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->astCtx).scope.ptr = &pCVar5->super_Scope;
  (this->astCtx).lookupIndex = 0xffffffff;
  (this->astCtx).flags.m_bits = 0;
  (this->astCtx).instanceOrProc = (Symbol *)0x0;
  (this->astCtx).firstTempVar = (TempVarSymbol *)0x0;
  (this->astCtx).randomizeDetails = (RandomizeDetails *)0x0;
  (this->astCtx).assertionInstance = (AssertionInstanceDetails *)0x0;
  (this->evalContext).astCtx.flags.m_bits = 0;
  (this->evalContext).astCtx.instanceOrProc = (Symbol *)0x0;
  (this->evalContext).astCtx.firstTempVar = (TempVarSymbol *)0x0;
  (this->evalContext).astCtx.randomizeDetails = (RandomizeDetails *)0x0;
  (this->evalContext).astCtx.assertionInstance = (AssertionInstanceDetails *)0x0;
  (this->evalContext).astCtx.scope.ptr = (this->astCtx).scope.ptr;
  (this->evalContext).astCtx.lookupIndex = (this->astCtx).lookupIndex;
  *(undefined4 *)&(this->evalContext).astCtx.field_0xc = *(undefined4 *)&(this->astCtx).field_0xc;
  (this->evalContext).flags.m_bits = '\x01';
  *(undefined8 *)&(this->evalContext).steps = 0;
  *(undefined8 *)((long)&(this->evalContext).disableTarget + 4) = 0;
  *(undefined4 *)((long)&(this->evalContext).queueTarget + 4) = 0;
  (this->evalContext).stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
       (pointer)(this->evalContext).stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                firstElement;
  (this->evalContext).stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
  (this->evalContext).stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
  (this->evalContext).lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
       (pointer)(this->evalContext).lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                firstElement;
  (this->evalContext).lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
  (this->evalContext).lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
  (this->evalContext).diags.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(this->evalContext).diags.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (this->evalContext).diags.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (this->evalContext).diags.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  (this->evalContext).warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(this->evalContext).warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (this->evalContext).warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (this->evalContext).warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  (this->evalContext).disableRange.startLoc = (SourceLocation)0x0;
  (this->evalContext).disableRange.endLoc = (SourceLocation)0x0;
  (this->evalContext).backtraceReported = false;
  EvalContext::pushEmptyFrame(&this->evalContext);
  return;
}

Assistant:

ScriptSession::ScriptSession(Bag options) :
    options(std::move(options)), compilation(createOptions(this->options)),
    scope(compilation.createScriptScope()), astCtx(scope, LookupLocation::max),
    evalContext(astCtx, EvalFlags::IsScript) {
    evalContext.pushEmptyFrame();
}